

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_api.c
# Opt level: O1

char * luaL_optlstring(lua_State *L,int idx,char *def,size_t *len)

{
  ulong uVar1;
  uint64_t uVar2;
  TValue *pTVar3;
  GCstr *pGVar4;
  size_t sVar5;
  
  pTVar3 = index2adr(L,idx);
  uVar1 = pTVar3->it64;
  if ((long)uVar1 >> 0x2f == 0xfffffffffffffffb) {
    pGVar4 = (GCstr *)(uVar1 & 0x7fffffffffff);
  }
  else {
    if (uVar1 == 0xffffffffffffffff) {
      if (len == (size_t *)0x0) {
        return def;
      }
      if (def == (char *)0x0) {
        sVar5 = 0;
      }
      else {
        sVar5 = strlen(def);
      }
      *len = sVar5;
      return def;
    }
    if (0xfffffffffffffff2 < (ulong)((long)uVar1 >> 0x2f)) {
      lj_err_argt(L,idx,4);
    }
    uVar2 = (L->glref).ptr64;
    if (*(ulong *)(uVar2 + 0x18) <= *(ulong *)(uVar2 + 0x10)) {
      lj_gc_step(L);
    }
    pTVar3 = index2adr(L,idx);
    pGVar4 = lj_strfmt_number(L,pTVar3);
    pTVar3->u64 = (ulong)pGVar4 | 0xfffd800000000000;
  }
  if (len != (size_t *)0x0) {
    *len = (ulong)pGVar4->len;
  }
  return (char *)(pGVar4 + 1);
}

Assistant:

LUALIB_API const char *luaL_optlstring(lua_State *L, int idx,
				       const char *def, size_t *len)
{
  TValue *o = index2adr(L, idx);
  GCstr *s;
  if (LJ_LIKELY(tvisstr(o))) {
    s = strV(o);
  } else if (tvisnil(o)) {
    if (len != NULL) *len = def ? strlen(def) : 0;
    return def;
  } else if (tvisnumber(o)) {
    lj_gc_check(L);
    o = index2adr(L, idx);  /* GC may move the stack. */
    s = lj_strfmt_number(L, o);
    setstrV(L, o, s);
  } else {
    lj_err_argt(L, idx, LUA_TSTRING);
  }
  if (len != NULL) *len = s->len;
  return strdata(s);
}